

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  REF_NODE pRVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  REF_BOOL increase_fuzz;
  
  ref_mpi = ref_interp->ref_mpi;
  pRVar1 = ref_interp->to_grid->node;
  if ((ref_interp->instrument == 0) || (uVar2 = ref_mpi_stopwatch_start(ref_mpi), uVar2 == 0)) {
    for (lVar7 = 0; lVar7 < pRVar1->max; lVar7 = lVar7 + 1) {
      if ((((-1 < pRVar1->global[lVar7]) && (pRVar1->ref_mpi->id == pRVar1->part[lVar7])) &&
          (ref_interp->cell[lVar7] != -1)) &&
         (uVar2 = ref_interp_push_onto_queue(ref_interp,(REF_INT)lVar7), uVar2 != 0)) {
        uVar4 = (ulong)uVar2;
        pcVar6 = "queue neighbors";
        uVar3 = 0x6e2;
        goto LAB_00167a0b;
      }
    }
    uVar2 = ref_interp_process_agents(ref_interp);
    if (uVar2 == 0) {
      if ((ref_interp->instrument == 0) ||
         (uVar2 = ref_mpi_stopwatch_stop(ref_mpi,"drain"), uVar2 == 0)) {
        increase_fuzz = 0;
        iVar5 = 0xd;
        while( true ) {
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) {
            if (increase_fuzz == 0) {
              return 0;
            }
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x6f7,"ref_interp_locate_warm","unable to grow fuzz to find tree candidate",0,
                   (long)increase_fuzz);
            return 1;
          }
          if ((increase_fuzz != 0) &&
             (ref_interp->search_fuzz = ref_interp->search_fuzz * 10.0, ref_mpi->id == 0)) {
            printf("retry tree search with %e fuzz\n");
          }
          uVar2 = ref_interp_tree(ref_interp,&increase_fuzz);
          if (uVar2 != 0) break;
          if ((ref_interp->instrument != 0) &&
             (uVar2 = ref_mpi_stopwatch_stop(ref_mpi,"tree"), uVar2 != 0)) {
            uVar4 = (ulong)uVar2;
            pcVar6 = "locate clock";
            uVar3 = 0x6f4;
            goto LAB_00167a0b;
          }
          if (increase_fuzz == 0) {
            return 0;
          }
        }
        uVar4 = (ulong)uVar2;
        pcVar6 = "tree";
        uVar3 = 0x6f2;
      }
      else {
        uVar4 = (ulong)uVar2;
        pcVar6 = "locate clock";
        uVar3 = 0x6e8;
      }
    }
    else {
      uVar4 = (ulong)uVar2;
      pcVar6 = "drain";
      uVar3 = 0x6e6;
    }
  }
  else {
    uVar4 = (ulong)uVar2;
    pcVar6 = "locate clock";
    uVar3 = 0x6de;
  }
LAB_00167a0b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar3,
         "ref_interp_locate_warm",uVar4,pcVar6);
  return (REF_STATUS)uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_warm(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE to_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  REF_BOOL increase_fuzz;
  REF_INT tries;
  REF_INT node;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    }
  }

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  for (tries = 0; tries < 12; tries++) {
    if (increase_fuzz) {
      ref_interp_search_fuzz(ref_interp) *= 10.0;
      if (ref_mpi_once(ref_mpi))
        printf("retry tree search with %e fuzz\n",
               ref_interp_search_fuzz(ref_interp));
    }
    RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
    if (ref_interp->instrument)
      RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");
    if (!increase_fuzz) break;
  }
  REIS(REF_FALSE, increase_fuzz, "unable to grow fuzz to find tree candidate");

  return REF_SUCCESS;
}